

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef
CompileLlvmFunctionContextAccess(LlvmCompilationContext *ctx,ExprFunctionContextAccess *node)

{
  LLVMBuilderRef pLVar1;
  TypeRef *pTVar2;
  TypeClass *pTVar3;
  LLVMTypeRef pLVar4;
  LLVMValueRefOpaque **ppLVar5;
  char *pcVar6;
  LLVMValueRef pLVar7;
  LLVMValueRef address;
  LLVMValueRef *variable;
  LLVMValueRef value;
  TypeClass *classType;
  TypeRef *refType;
  ExprFunctionContextAccess *node_local;
  LlvmCompilationContext *ctx_local;
  
  pTVar2 = getType<TypeRef>(node->function->contextType);
  if (pTVar2 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x671,
                  "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                 );
  }
  pTVar3 = getType<TypeClass>(pTVar2->subType);
  if (pTVar3 != (TypeClass *)0x0) {
    if ((pTVar3->super_TypeStruct).super_TypeBase.size == 0) {
      pLVar4 = CompileLlvmType(ctx,(node->super_ExprBase).type);
      variable = (LLVMValueRef *)LLVMConstPointerNull(pLVar4);
    }
    else {
      ppLVar5 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                ::find(&ctx->variables,&node->contextVariable->uniqueId);
      if (ppLVar5 == (LLVMValueRefOpaque **)0x0) {
        __assert_fail("variable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x681,
                      "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                     );
      }
      pLVar7 = *ppLVar5;
      pLVar1 = ctx->builder;
      pcVar6 = CreateLlvmName(ctx,node->contextVariable->name->name);
      variable = (LLVMValueRef *)LLVMBuildLoad(pLVar1,pLVar7,pcVar6);
    }
    pLVar7 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)variable);
    return pLVar7;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x675,
                "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &ctx, ExprFunctionContextAccess *node)
{
	TypeRef *refType = getType<TypeRef>(node->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	LLVMValueRef value = NULL;

	if(classType->size == 0)
	{
		value = LLVMConstPointerNull(CompileLlvmType(ctx, node->type));
	}
	else
	{
		LLVMValueRef *variable = ctx.variables.find(node->contextVariable->uniqueId);

		assert(variable);

		LLVMValueRef address = *variable;

		value = LLVMBuildLoad(ctx.builder, address, CreateLlvmName(ctx, node->contextVariable->name->name));
	}

	return CheckType(ctx, node, value);
}